

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bool fmt::v5::internal::grisu2_gen_digits
               (char *buf,int *size,uint32_t hi,uint64_t lo,int *exp,uint64_t delta,fp *one,fp *diff
               ,int max_digits)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  uint64_t exp_00;
  significand_type diff_00;
  int iVar9;
  
  iVar9 = *exp;
  do {
    if (iVar9 < 1) {
      iVar6 = *size;
      do {
        cVar8 = (char)(lo * 10 >> (-(char)one->e & 0x3fU));
        iVar5 = iVar9;
        if (cVar8 != '\0' || iVar6 != 0) {
          *size = iVar6 + 1;
          buf[iVar6] = cVar8 + '0';
          iVar5 = *exp;
        }
        delta = delta * 10;
        exp_00 = one->f;
        lo = exp_00 - 1 & lo * 10;
        iVar9 = iVar5 + -1;
        *exp = iVar9;
      } while ((delta <= lo) && (iVar6 = *size, iVar6 <= max_digits));
      diff_00 = (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 + (long)(1 - iVar5) * 4) *
                diff->f;
      goto LAB_00138285;
    }
    switch(iVar9) {
    case 1:
      uVar1 = 0;
      uVar4 = hi;
      goto LAB_00138198;
    case 2:
      uVar4 = hi / 10;
      iVar6 = (hi / 10) * 10;
      break;
    case 3:
      uVar4 = hi / 100;
      iVar6 = (hi / 100) * 100;
      break;
    case 4:
      uVar4 = hi / 1000;
      iVar6 = (hi / 1000) * 1000;
      break;
    case 5:
      uVar4 = hi / 10000;
      iVar6 = (hi / 10000) * 10000;
      break;
    case 6:
      uVar4 = (hi >> 5) / 0xc35;
      iVar6 = ((hi >> 5) / 0xc35) * 100000;
      break;
    case 7:
      uVar4 = hi / 1000000;
      iVar6 = (hi / 1000000) * 1000000;
      break;
    case 8:
      uVar4 = hi / 10000000;
      iVar6 = (hi / 10000000) * 10000000;
      break;
    case 9:
      uVar4 = hi / 100000000;
      iVar6 = (hi / 100000000) * 100000000;
      break;
    case 10:
      uVar1 = (uint)((ulong)(hi >> 9) * 0x44b83 >> 0x20);
      uVar4 = uVar1 >> 7;
      iVar6 = (uVar1 >> 7) * 1000000000;
      break;
    default:
      uVar1 = hi;
      uVar4 = 0;
      goto LAB_00138198;
    }
    uVar1 = hi - iVar6;
LAB_00138198:
    hi = uVar1;
    iVar6 = *size;
    if (uVar4 != 0 || iVar6 != 0) {
      *size = iVar6 + 1;
      buf[iVar6] = (char)uVar4 + '0';
      iVar9 = *exp;
    }
    iVar9 = iVar9 + -1;
    *exp = iVar9;
    bVar3 = -(char)one->e;
    uVar7 = ((ulong)hi << (bVar3 & 0x3f)) + lo;
    if ((uVar7 <= delta) || (max_digits < *size)) {
      exp_00 = (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 + (long)iVar9 * 4) <<
               (bVar3 & 0x3f);
      diff_00 = diff->f;
      lo = uVar7;
LAB_00138285:
      bVar2 = grisu2_round(buf,size,max_digits,delta,lo,exp_00,diff_00,exp);
      return bVar2;
    }
  } while( true );
}

Assistant:

FMT_FUNC bool grisu2_gen_digits(
    char *buf, int &size, uint32_t hi, uint64_t lo, int &exp,
    uint64_t delta, const fp &one, const fp &diff, int max_digits) {
  // Generate digits for the most significant part (hi).
  while (exp > 0) {
    uint32_t digit = 0;
    // This optimization by miloyip reduces the number of integer divisions by
    // one per iteration.
    switch (exp) {
    case 10: digit = hi / 1000000000; hi %= 1000000000; break;
    case  9: digit = hi /  100000000; hi %=  100000000; break;
    case  8: digit = hi /   10000000; hi %=   10000000; break;
    case  7: digit = hi /    1000000; hi %=    1000000; break;
    case  6: digit = hi /     100000; hi %=     100000; break;
    case  5: digit = hi /      10000; hi %=      10000; break;
    case  4: digit = hi /       1000; hi %=       1000; break;
    case  3: digit = hi /        100; hi %=        100; break;
    case  2: digit = hi /         10; hi %=         10; break;
    case  1: digit = hi;              hi =           0; break;
    default:
      FMT_ASSERT(false, "invalid number of digits");
    }
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    --exp;
    uint64_t remainder = (static_cast<uint64_t>(hi) << -one.e) + lo;
    if (remainder <= delta || size > max_digits) {
      return grisu2_round(
            buf, size, max_digits, delta, remainder,
            static_cast<uint64_t>(data::POWERS_OF_10_32[exp]) << -one.e,
            diff.f, exp);
    }
  }
  // Generate digits for the least significant part (lo).
  for (;;) {
    lo *= 10;
    delta *= 10;
    char digit = static_cast<char>(lo >> -one.e);
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    lo &= one.f - 1;
    --exp;
    if (lo < delta || size > max_digits) {
      return grisu2_round(buf, size, max_digits, delta, lo, one.f,
                          diff.f * data::POWERS_OF_10_32[-exp], exp);
    }
  }
}